

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getBasicVariablesInterface(Highs *this,HighsInt *basic_variables)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  HighsStatus HVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  allocator local_f9;
  string local_f8;
  HighsLogOptions local_d8;
  HighsLpSolverObject solver_object;
  
  uVar1 = (this->model_).lp_.num_row_;
  if (uVar1 == 0) {
    HVar4 = kOk;
  }
  else if ((this->basis_).valid == false) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getBasicVariables called without a HiGHS basis\n");
    HVar4 = kError;
  }
  else {
    iVar2 = (this->model_).lp_.num_col_;
    if ((this->ekk_instance_).status_.has_invert == false) {
      solver_object.lp_ = &(this->model_).lp_;
      solver_object.ekk_instance_ = &this->ekk_instance_;
      solver_object.basis_ = &this->basis_;
      solver_object.solution_ = &this->solution_;
      solver_object.highs_info_ = &this->info_;
      solver_object.callback_ = &this->callback_;
      solver_object.options_ = &this->options_;
      solver_object.timer_ = &this->timer_;
      solver_object.model_status_ = kMin;
      HighsLogOptions::HighsLogOptions
                (&local_d8,&(this->options_).super_HighsOptionsStruct.log_options);
      HVar4 = formSimplexLpBasisAndFactor(&solver_object,true);
      std::__cxx11::string::string((string *)&local_f8,"formSimplexLpBasisAndFactor",&local_f9);
      HVar4 = interpretCallStatus(&local_d8,HVar4,kOk,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::_Function_base::~_Function_base(&local_d8.user_callback.super__Function_base);
      if (HVar4 != kOk) {
        return HVar4;
      }
    }
    piVar3 = (this->ekk_instance_).basis_.basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    HVar4 = kOk;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = piVar3[uVar5];
      uVar6 = ~uVar1 + iVar2;
      if ((int)uVar1 < iVar2) {
        uVar6 = uVar1;
      }
      basic_variables[uVar5] = uVar6;
    }
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::getBasicVariablesInterface(HighsInt* basic_variables) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_col = lp.num_col_;
  HighsSimplexStatus& ekk_status = ekk_instance_.status_;
  // For an LP with no rows the solution is vacuous
  if (num_row == 0) return return_status;
  if (!basis_.valid) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasicVariables called without a HiGHS basis\n");
    return HighsStatus::kError;
  }
  if (!ekk_status.has_invert) {
    // The LP has no invert to use, so have to set one up, but only
    // for the current basis, so return_value is the rank deficiency.
    HighsLpSolverObject solver_object(lp, basis_, solution_, info_,
                                      ekk_instance_, callback_, options_,
                                      timer_);
    const bool only_from_known_basis = true;
    return_status = interpretCallStatus(
        options_.log_options,
        formSimplexLpBasisAndFactor(solver_object, only_from_known_basis),
        return_status, "formSimplexLpBasisAndFactor");
    if (return_status != HighsStatus::kOk) return return_status;
  }
  assert(ekk_status.has_invert);

  for (HighsInt row = 0; row < num_row; row++) {
    HighsInt var = ekk_instance_.basis_.basicIndex_[row];
    if (var < num_col) {
      basic_variables[row] = var;
    } else {
      basic_variables[row] = -(1 + var - num_col);
    }
  }
  return return_status;
}